

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O1

void __thiscall
btPerturbedContactResult::addContactPoint
          (btPerturbedContactResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar orgDepth)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  undefined1 local_78 [16];
  float local_60;
  float local_5c;
  float local_58;
  float local_50;
  float local_4c;
  float local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  
  local_98 = ZEXT416((uint)(normalOnBInWorld->m_floats[0] * orgDepth + pointInWorld->m_floats[0]));
  local_a8 = ZEXT416((uint)(normalOnBInWorld->m_floats[1] * orgDepth + pointInWorld->m_floats[1]));
  local_88 = orgDepth * normalOnBInWorld->m_floats[2] + pointInWorld->m_floats[2];
  if (this->m_perturbA == true) {
    btTransform::inverse(&this->m_transformA);
    fVar7 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[0];
    fVar9 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[1];
    fVar10 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[2];
    fVar8 = (local_38 * fVar10 + local_58 * fVar7 + local_48 * fVar9) * local_88 +
            (local_40 * fVar10 + local_60 * fVar7 + local_50 * fVar9) * (float)local_98._0_4_ +
            (local_3c * fVar10 + local_5c * fVar7 + local_4c * fVar9) * (float)local_a8._0_4_ +
            fVar10 * local_28 + fVar7 * local_30 + fVar9 * local_2c +
            (this->m_unPerturbedTransform).m_origin.m_floats[2];
    fVar12 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[1];
    fVar7 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[1];
    fVar13 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[0];
    fVar9 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[0];
    fVar1 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[2];
    fVar10 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[2];
    uVar4 = *(undefined8 *)(this->m_unPerturbedTransform).m_origin.m_floats;
    fVar12 = local_88 * (local_38 * fVar1 + local_58 * fVar13 + local_48 * fVar12) +
             (float)local_98._0_4_ * (local_40 * fVar1 + local_60 * fVar13 + local_50 * fVar12) +
             (float)local_a8._0_4_ * (local_3c * fVar1 + local_5c * fVar13 + local_4c * fVar12) +
             (float)uVar4 + local_28 * fVar1 + local_30 * fVar13 + local_2c * fVar12;
    fVar13 = local_88 * (local_38 * fVar10 + local_58 * fVar9 + local_48 * fVar7) +
             (float)local_98._0_4_ * (local_40 * fVar10 + local_60 * fVar9 + local_50 * fVar7) +
             (float)local_a8._0_4_ * (local_3c * fVar10 + local_5c * fVar9 + local_4c * fVar7) +
             (float)((ulong)uVar4 >> 0x20) + local_28 * fVar10 + local_30 * fVar9 + local_2c * fVar7
    ;
    fVar9 = (float)*(undefined8 *)normalOnBInWorld->m_floats;
    fVar10 = (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20);
    fVar7 = (fVar8 - pointInWorld->m_floats[2]) * normalOnBInWorld->m_floats[2] +
            (fVar12 - pointInWorld->m_floats[0]) * fVar9 +
            fVar10 * (fVar13 - pointInWorld->m_floats[1]);
    local_e8._4_4_ = fVar7 * fVar10 + fVar13;
    local_e8._0_4_ = fVar7 * fVar9 + fVar12;
    local_e8._8_4_ = normalOnBInWorld->m_floats[2] * fVar7 + fVar8;
  }
  else {
    btTransform::inverse(&this->m_transformB);
    local_78 = ZEXT416((uint)local_40);
    fVar7 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[0];
    fVar9 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[1];
    fVar10 = (this->m_unPerturbedTransform).m_basis.m_el[2].m_floats[2];
    fVar12 = pointInWorld->m_floats[1];
    fVar13 = pointInWorld->m_floats[0];
    fVar1 = pointInWorld->m_floats[2];
    fVar11 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[1];
    fVar8 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[1];
    fVar5 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[0];
    fVar2 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[0];
    fVar6 = (this->m_unPerturbedTransform).m_basis.m_el[0].m_floats[2];
    fVar3 = (this->m_unPerturbedTransform).m_basis.m_el[1].m_floats[2];
    uVar4 = *(undefined8 *)(this->m_unPerturbedTransform).m_origin.m_floats;
    fVar11 = fVar1 * (local_38 * fVar6 + local_58 * fVar5 + local_48 * fVar11) +
             fVar13 * (local_40 * fVar6 + local_60 * fVar5 + local_50 * fVar11) +
             fVar12 * (local_3c * fVar6 + local_5c * fVar5 + local_4c * fVar11) +
             (float)uVar4 + local_28 * fVar6 + local_30 * fVar5 + local_2c * fVar11;
    fVar8 = fVar1 * (local_38 * fVar3 + local_58 * fVar2 + local_48 * fVar8) +
            fVar13 * (local_40 * fVar3 + local_60 * fVar2 + local_50 * fVar8) +
            fVar12 * (local_3c * fVar3 + local_5c * fVar2 + local_4c * fVar8) +
            (float)((ulong)uVar4 >> 0x20) + local_28 * fVar3 + local_30 * fVar2 + local_2c * fVar8;
    fVar7 = (local_38 * fVar10 + local_58 * fVar7 + local_48 * fVar9) * fVar1 +
            (local_40 * fVar10 + local_60 * fVar7 + local_50 * fVar9) * fVar13 +
            (local_3c * fVar10 + local_5c * fVar7 + local_4c * fVar9) * fVar12 +
            fVar10 * local_28 + fVar7 * local_30 + fVar9 * local_2c +
            (this->m_unPerturbedTransform).m_origin.m_floats[2];
    local_e8._4_4_ = fVar8;
    local_e8._0_4_ = fVar11;
    local_e8._8_4_ = fVar7;
    fVar7 = (local_88 - fVar7) * normalOnBInWorld->m_floats[2] +
            ((float)local_98._0_4_ - fVar11) * normalOnBInWorld->m_floats[0] +
            ((float)local_a8._0_4_ - fVar8) * normalOnBInWorld->m_floats[1];
    local_40 = local_4c;
  }
  local_b8 = ZEXT416((uint)local_48);
  local_c8 = ZEXT416((uint)local_3c);
  local_d8 = ZEXT416((uint)local_40);
  local_e8._12_4_ = 0;
  (*(this->m_originalManifoldResult->super_Result)._vptr_Result[4])
            (fVar7,this->m_originalManifoldResult,normalOnBInWorld,local_e8);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar orgDepth)
	{
		btVector3 endPt,startPt;
		btScalar newDepth;
		btVector3 newNormal;

		if (m_perturbA)
		{
			btVector3 endPtOrg = pointInWorld + normalOnBInWorld*orgDepth;
			endPt = (m_unPerturbedTransform*m_transformA.inverse())(endPtOrg);
			newDepth = (endPt -  pointInWorld).dot(normalOnBInWorld);
			startPt = endPt+normalOnBInWorld*newDepth;
		} else
		{
			endPt = pointInWorld + normalOnBInWorld*orgDepth;
			startPt = (m_unPerturbedTransform*m_transformB.inverse())(pointInWorld);
			newDepth = (endPt -  startPt).dot(normalOnBInWorld);
			
		}

//#define DEBUG_CONTACTS 1
#ifdef DEBUG_CONTACTS
		m_debugDrawer->drawLine(startPt,endPt,btVector3(1,0,0));
		m_debugDrawer->drawSphere(startPt,0.05,btVector3(0,1,0));
		m_debugDrawer->drawSphere(endPt,0.05,btVector3(0,0,1));
#endif //DEBUG_CONTACTS

		
		m_originalManifoldResult->addContactPoint(normalOnBInWorld,startPt,newDepth);
	}